

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateWriter.cpp
# Opt level: O0

EStatusCode __thiscall StateWriter::Finish(StateWriter *this)

{
  LongFilePositionType local_20;
  LongFilePositionType xrefTablePosition;
  StateWriter *pSStack_10;
  EStatusCode status;
  StateWriter *this_local;
  
  pSStack_10 = this;
  xrefTablePosition._4_4_ = ObjectsContext::WriteXrefTable(this->mObjectsContext,&local_20);
  if (xrefTablePosition._4_4_ == eSuccess) {
    WriteTrailerDictionary(this);
    WriteXrefReference(this,local_20);
    WriteFinalEOF(this);
  }
  if (xrefTablePosition._4_4_ == eSuccess) {
    xrefTablePosition._4_4_ = OutputFile::CloseFile(&this->mOutputFile);
  }
  else {
    OutputFile::CloseFile(&this->mOutputFile);
  }
  return xrefTablePosition._4_4_;
}

Assistant:

EStatusCode StateWriter::Finish()
{
	EStatusCode status;
	do
	{
		LongFilePositionType xrefTablePosition;

		status = mObjectsContext->WriteXrefTable(xrefTablePosition);
		if(status != 0)
			break;

		WriteTrailerDictionary();
		WriteXrefReference(xrefTablePosition);
		WriteFinalEOF();


	} while(false);
		
	if(PDFHummus::eSuccess == status)
		status = mOutputFile.CloseFile();
	else
		mOutputFile.CloseFile();
	return status;	
}